

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol(Tables *this,string *full_name,Symbol symbol)

{
  bool bVar1;
  second_type *value;
  unordered_map<const_char_*,_google::protobuf::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>_>
  *collection;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  long in_RDI;
  value_type *in_stack_ffffffffffffffa8;
  first_type *in_stack_ffffffffffffffc8;
  
  value = (second_type *)(in_RDI + 0x138);
  collection = (unordered_map<const_char_*,_google::protobuf::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>_>
                *)std::__cxx11::string::c_str();
  bVar1 = InsertIfNotPresent<std::unordered_map<char_const*,google::protobuf::Symbol,google::protobuf::hash<char_const*>,google::protobuf::streq,std::allocator<std::pair<char_const*const,google::protobuf::Symbol>>>>
                    (collection,in_stack_ffffffffffffffc8,value);
  if (bVar1) {
    this_00 = (vector<const_char_*,_std::allocator<const_char_*>_> *)(in_RDI + 0x1f0);
    std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (this_00,in_stack_ffffffffffffffa8);
  }
  return bVar1;
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(const std::string& full_name,
                                       Symbol symbol) {
  if (InsertIfNotPresent(&symbols_by_name_, full_name.c_str(), symbol)) {
    symbols_after_checkpoint_.push_back(full_name.c_str());
    return true;
  } else {
    return false;
  }
}